

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O3

void __thiscall
AddressFactory_Constructor_type_Test::TestBody(AddressFactory_Constructor_type_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  AddressFactory factory_7;
  Pubkey pubkey;
  AddressFactory factory;
  Message local_7d8;
  AssertHelper local_7d0;
  AssertHelper local_7c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7c0;
  AddressFactory local_7b8;
  Pubkey local_790;
  undefined1 local_778 [32];
  uchar local_758 [16];
  void *local_748;
  void *local_730;
  void *local_718;
  code *local_700 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_688;
  Script local_670;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_630;
  Pubkey local_600;
  uchar local_5e0 [16];
  void *local_5d0;
  void *local_5b8;
  void *local_5a0;
  code *local_588 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_510;
  Script local_4f8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4b8;
  Pubkey local_488;
  uchar local_468 [16];
  void *local_458;
  void *local_440;
  void *local_428;
  code *local_410 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_398;
  Script local_380;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_340;
  Pubkey local_310;
  uchar local_2f0 [16];
  void *local_2e0;
  void *local_2c8;
  void *local_2b0;
  code *local_298 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_220;
  Script local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  Pubkey local_198;
  uchar local_178 [16];
  void *local_168;
  void *local_150;
  void *local_138;
  code *local_120 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a8;
  Script local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kMainnet);
      local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_778 + 0x10));
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2b,
               "Expected: AddressFactory factory(NetType::kMainnet) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kTestnet);
      local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_778 + 0x10));
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2c,
               "Expected: AddressFactory factory(NetType::kTestnet) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kRegtest);
      local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_778 + 0x10));
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2d,
               "Expected: AddressFactory factory(NetType::kRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kLiquidV1);
      local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_778 + 0x10));
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2e,
               "Expected: AddressFactory factory(NetType::kLiquidV1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kElementsRegtest);
      local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_778 + 0x10));
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x2f,
               "Expected: AddressFactory factory(NetType::kElementsRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kCustomChain);
      local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_778 + 0x10));
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x30,
               "Expected: AddressFactory factory(NetType::kCustomChain) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kCustomChain);
      local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )(local_778 + 0x10));
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x31,
               "Expected: AddressFactory factory(NetType::kNetTypeNum) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  local_778._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_778 + 0x10)
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_778,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af","");
  cfd::core::Pubkey::Pubkey(&local_790,(string *)local_778);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_778 + 0x10))
  {
    operator_delete((void *)local_778._0_8_);
  }
  cfd::AddressFactory::AddressFactory(&local_7b8,kMainnet);
  cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)local_778);
  local_7d8.ss_.ptr_._0_4_ = local_778._0_4_;
  local_7d0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_7c8,"address.GetNetType()","NetType::kMainnet",(NetType *)&local_7d8
             ,(NetType *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x38,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_7d8.ss_.ptr_._0_4_ = local_778._8_4_;
  local_7d0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_7c8,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_7d8,(WitnessVersion *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_630);
  cfd::core::Script::~Script(&local_670);
  local_700[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_688);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_700);
  if (local_718 != (void *)0x0) {
    operator_delete(local_718);
  }
  if (local_730 != (void *)0x0) {
    operator_delete(local_730);
  }
  if (local_748 != (void *)0x0) {
    operator_delete(local_748);
  }
  if ((uchar *)local_778._16_8_ != local_758) {
    operator_delete((void *)local_778._16_8_);
  }
  local_7b8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_7b8.prefix_list_);
  cfd::AddressFactory::AddressFactory(&local_7b8,kTestnet);
  cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)local_778);
  local_7d8.ss_.ptr_._0_4_ = local_778._0_4_;
  local_7d0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_7c8,"address.GetNetType()","NetType::kTestnet",(NetType *)&local_7d8
             ,(NetType *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_7d8.ss_.ptr_._0_4_ = local_778._8_4_;
  local_7d0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_7c8,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_7d8,(WitnessVersion *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_630);
  cfd::core::Script::~Script(&local_670);
  local_700[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_688);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_700);
  if (local_718 != (void *)0x0) {
    operator_delete(local_718);
  }
  if (local_730 != (void *)0x0) {
    operator_delete(local_730);
  }
  if (local_748 != (void *)0x0) {
    operator_delete(local_748);
  }
  if ((uchar *)local_778._16_8_ != local_758) {
    operator_delete((void *)local_778._16_8_);
  }
  local_7b8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_7b8.prefix_list_);
  cfd::AddressFactory::AddressFactory(&local_7b8,kRegtest);
  cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)local_778);
  local_7d8.ss_.ptr_._0_4_ = local_778._0_4_;
  local_7d0.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_7c8,"address.GetNetType()","NetType::kRegtest",(NetType *)&local_7d8
             ,(NetType *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_7d8.ss_.ptr_._0_4_ = local_778._8_4_;
  local_7d0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_7c8,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_7d8,(WitnessVersion *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x45,pcVar2);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_630);
  cfd::core::Script::~Script(&local_670);
  local_700[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_688);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_700);
  if (local_718 != (void *)0x0) {
    operator_delete(local_718);
  }
  if (local_730 != (void *)0x0) {
    operator_delete(local_730);
  }
  if (local_748 != (void *)0x0) {
    operator_delete(local_748);
  }
  if ((uchar *)local_778._16_8_ != local_758) {
    operator_delete((void *)local_778._16_8_);
  }
  local_7b8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_7b8.prefix_list_);
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kLiquidV1);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_198);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_50);
    cfd::core::Script::~Script(&local_90);
    local_120[0] = cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a8)
    ;
    cfd::core::TapBranch::~TapBranch((TapBranch *)local_120);
    if (local_138 != (void *)0x0) {
      operator_delete(local_138);
    }
    if (local_150 != (void *)0x0) {
      operator_delete(local_150);
    }
    if (local_168 != (void *)0x0) {
      operator_delete(local_168);
    }
    if (local_198.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != local_178) {
      operator_delete(local_198.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
  }
  testing::Message::Message((Message *)&local_7b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_7c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0x49,
             "Expected: factory.CreateP2pkhAddress(pubkey) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_7c8,(Message *)&local_7b8);
  testing::internal::AssertHelper::~AssertHelper(&local_7c8);
  if (local_7b8._vptr_AddressFactory != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_7b8._vptr_AddressFactory != (_func_int **)0x0)) {
      (**(code **)(*local_7b8._vptr_AddressFactory + 8))();
    }
  }
  local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             (local_778 + 0x10));
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kElementsRegtest);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_310);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1c8);
    cfd::core::Script::~Script(&local_208);
    local_298[0] = cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_220);
    cfd::core::TapBranch::~TapBranch((TapBranch *)local_298);
    if (local_2b0 != (void *)0x0) {
      operator_delete(local_2b0);
    }
    if (local_2c8 != (void *)0x0) {
      operator_delete(local_2c8);
    }
    if (local_2e0 != (void *)0x0) {
      operator_delete(local_2e0);
    }
    if (local_310.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != local_2f0) {
      operator_delete(local_310.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
  }
  testing::Message::Message((Message *)&local_7b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_7c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0x4d,
             "Expected: factory.CreateP2pkhAddress(pubkey) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_7c8,(Message *)&local_7b8);
  testing::internal::AssertHelper::~AssertHelper(&local_7c8);
  if (local_7b8._vptr_AddressFactory != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_7b8._vptr_AddressFactory != (_func_int **)0x0)) {
      (**(code **)(*local_7b8._vptr_AddressFactory + 8))();
    }
  }
  local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             (local_778 + 0x10));
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kCustomChain);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_488);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_340);
    cfd::core::Script::~Script(&local_380);
    local_410[0] = cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_398);
    cfd::core::TapBranch::~TapBranch((TapBranch *)local_410);
    if (local_428 != (void *)0x0) {
      operator_delete(local_428);
    }
    if (local_440 != (void *)0x0) {
      operator_delete(local_440);
    }
    if (local_458 != (void *)0x0) {
      operator_delete(local_458);
    }
    if (local_488.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != local_468) {
      operator_delete(local_488.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
  }
  testing::Message::Message((Message *)&local_7b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_7c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0x51,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_7c8,(Message *)&local_7b8);
  testing::internal::AssertHelper::~AssertHelper(&local_7c8);
  if (local_7b8._vptr_AddressFactory != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_7b8._vptr_AddressFactory != (_func_int **)0x0)) {
      (**(code **)(*local_7b8._vptr_AddressFactory + 8))();
    }
  }
  local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             (local_778 + 0x10));
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kCustomChain);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_600);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_4b8);
    cfd::core::Script::~Script(&local_4f8);
    local_588[0] = cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_510);
    cfd::core::TapBranch::~TapBranch((TapBranch *)local_588);
    if (local_5a0 != (void *)0x0) {
      operator_delete(local_5a0);
    }
    if (local_5b8 != (void *)0x0) {
      operator_delete(local_5b8);
    }
    if (local_5d0 != (void *)0x0) {
      operator_delete(local_5d0);
    }
    if (local_600.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != local_5e0) {
      operator_delete(local_600.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    }
  }
  testing::Message::Message((Message *)&local_7b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_7c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
             ,0x55,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_7c8,(Message *)&local_7b8);
  testing::internal::AssertHelper::~AssertHelper(&local_7c8);
  if (local_7b8._vptr_AddressFactory != (_func_int **)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_7b8._vptr_AddressFactory != (_func_int **)0x0)) {
      (**(code **)(*local_7b8._vptr_AddressFactory + 8))();
    }
  }
  local_778._0_8_ = &PTR__AddressFactory_002d9fd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             (local_778 + 0x10));
  if (local_790.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_790.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kLiquidV1));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kElementsRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kCustomChain));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kNetTypeNum));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");

  {
    AddressFactory factory(NetType::kMainnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kLiquidV1);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kCustomChain);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    AddressFactory factory(NetType::kNetTypeNum);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}